

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::removeMember(Value *__return_storage_ptr__,Value *this,char *key)

{
  size_t sVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [376];
  
  if (this->field_0x8 == '\0') {
    Value(__return_storage_ptr__,(Value *)kNull);
  }
  else {
    if (this->field_0x8 != '\b') {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"in Json::Value::removeMember(): requires objectValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      _Unwind_Resume(extraout_RAX);
    }
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         *(ushort *)&__return_storage_ptr__->field_0x8 & 0xfe00;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    sVar1 = strlen(key);
    removeMember(this,key,key + sVar1,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::removeMember(const char* key)
{
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return nullRef;

  Value removed;  // null
  removeMember(key, key + strlen(key), &removed);
  return removed; // still null if removeMember() did nothing
}